

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi)

{
  byte bVar1;
  PaUtilAllocationGroup *pPVar2;
  char *__s2;
  snd_ctl_t *psVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  char *pcVar17;
  pthread_t __thread1;
  PaDeviceInfo **ppPVar18;
  PaAlsaDeviceInfo *devInfo;
  PaAlsaHostApiRepresentation *pPVar19;
  char *pcVar20;
  char *pcVar21;
  byte *pbVar22;
  byte *pbVar23;
  int __pa_unsure_error_id;
  HwDevInfo *pHVar24;
  HwDevInfo *deviceHwInfo;
  snd_ctl_t *psVar25;
  PaAlsaDeviceInfo *devInfo_00;
  bool bVar26;
  undefined8 uStack_140;
  char local_138 [8];
  char alsaCardName [50];
  char *local_f8;
  char buf [50];
  char *local_b8;
  char *alsaDeviceName;
  char *local_a8;
  undefined8 local_a0;
  snd_config_t *topNode;
  snd_ctl_t *local_90;
  char *local_88;
  int local_80;
  uint local_7c;
  int cardIdx;
  char *cardName;
  snd_ctl_t *ctl;
  int local_60;
  int local_5c;
  int devIdx;
  int devIdx_1;
  PaAlsaHostApiRepresentation *local_50;
  HwDevInfo *local_48;
  snd_ctl_t *local_40;
  ulong local_38;
  
  local_80 = -1;
  local_60 = 0;
  local_a0 = 0;
  uStack_140 = 0x10e5bf;
  pcVar9 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar9 == (char *)0x0) {
    local_7c = 1;
  }
  else {
    uStack_140 = 0x10e5cc;
    iVar5 = atoi(pcVar9);
    local_7c = (uint)(iVar5 == 0);
  }
  uStack_140 = 0x10e5eb;
  pcVar9 = getenv("PA_ALSA_PLUGHW");
  local_38 = 0;
  if (pcVar9 == (char *)0x0) {
    local_a8 = "";
    topNode._4_4_ = 0;
  }
  else {
    uStack_140 = 0x10e600;
    iVar5 = atoi(pcVar9);
    topNode._4_4_ = (uint)(iVar5 != 0);
    local_a8 = "";
    if (iVar5 != 0) {
      local_a8 = "plug";
    }
  }
  (alsaApi->baseHostApiRep).info.defaultInputDevice = -1;
  (alsaApi->baseHostApiRep).info.defaultOutputDevice = -1;
  local_80 = -1;
  uStack_140 = 0x10e65b;
  local_50 = alsaApi;
  sVar10 = snd_ctl_card_info_sizeof();
  lVar13 = -(sVar10 + 0xf & 0xfffffffffffffff0);
  pcVar9 = local_138 + lVar13;
  pcVar20 = local_138 + lVar13 + -8;
  alsaDeviceName = pcVar9;
  pcVar20[0] = '}';
  pcVar20[1] = -0x1a;
  pcVar20[2] = '\x10';
  pcVar20[3] = '\0';
  pcVar20[4] = '\0';
  pcVar20[5] = '\0';
  pcVar20[6] = '\0';
  pcVar20[7] = '\0';
  memset(pcVar9,0,sVar10);
  pcVar21 = local_138 + lVar13 + -8;
  pcVar21[0] = -0x7e;
  pcVar21[1] = -0x1a;
  pcVar21[2] = '\x10';
  pcVar21[3] = '\0';
  pcVar21[4] = '\0';
  pcVar21[5] = '\0';
  pcVar21[6] = '\0';
  pcVar21[7] = '\0';
  sVar10 = snd_pcm_info_sizeof();
  pcVar9 = pcVar9 + -(sVar10 + 0xf & 0xfffffffffffffff0);
  pcVar9[-8] = -0x60;
  pcVar9[-7] = -0x1a;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  memset(pcVar9,0,sVar10);
  pcVar9[-8] = -0x58;
  pcVar9[-7] = -0x1a;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  iVar5 = snd_card_next(&local_80);
  pPVar19 = local_50;
  if (local_80 < 0 || iVar5 != 0) {
    ctl = (snd_ctl_t *)0x1;
    local_48 = (HwDevInfo *)0x0;
    psVar25 = (snd_ctl_t *)0x0;
  }
  else {
    ctl = (snd_ctl_t *)0x1;
    local_38 = 0;
    psVar25 = (snd_ctl_t *)0x0;
    local_48 = (HwDevInfo *)0x0;
    local_88 = pcVar9;
    do {
      local_5c = -1;
      pcVar9[-8] = '\x0e';
      pcVar9[-7] = -0x19;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      snprintf(local_138,0x32,"hw:%d");
      pcVar9[-8] = '\x1c';
      pcVar9[-7] = -0x19;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      iVar5 = snd_ctl_open(&cardName,local_138,0);
      pcVar17 = cardName;
      pcVar11 = alsaDeviceName;
      if (iVar5 < 0) {
        iVar5 = 6;
      }
      else {
        pcVar9[-8] = '7';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        snd_ctl_card_info(pcVar17,pcVar11);
        pcVar9[-8] = '?';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        pcVar11 = (char *)snd_ctl_card_info_get_name(pcVar11);
        pcVar9[-8] = 'N';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        paUtilErr_ = PaAlsa_StrDup(pPVar19,(char **)&cardIdx,pcVar11);
        pcVar11 = cardName;
        if (paUtilErr_ < 0) {
          pcVar9[-8] = -0x54;
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          PaUtil_DebugPrint(
                           "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1291\n"
                           );
          iVar5 = 10;
          local_38 = (ulong)(uint)paUtilErr_;
        }
        else {
          pcVar9[-8] = 'i';
          pcVar9[-7] = -0x19;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar5 = snd_ctl_pcm_next_device(pcVar11,&local_5c);
          pcVar11 = local_88;
          if (-1 < local_5c && iVar5 == 0) {
            do {
              pcVar17 = local_a8;
              pcVar9[-8] = -0x55;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snprintf((char *)&local_f8,0x32,"%s%s,%d",pcVar17,local_138);
              iVar5 = local_5c;
              pcVar9[-8] = -0x4a;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snd_pcm_info_set_device(pcVar11,iVar5);
              pcVar9[-8] = -0x40;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snd_pcm_info_set_subdevice(pcVar11,0);
              pcVar9[-8] = -0x33;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snd_pcm_info_set_stream(pcVar11,1);
              pcVar17 = cardName;
              pcVar9[-8] = -0x27;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              uVar6 = snd_ctl_pcm_info(pcVar17,pcVar11);
              pcVar9[-8] = -0x1a;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snd_pcm_info_set_stream(pcVar11,0);
              pcVar17 = cardName;
              pcVar9[-8] = -0xe;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              uVar7 = snd_ctl_pcm_info(pcVar17);
              if ((int)(uVar7 & uVar6) < 0) {
                iVar5 = 0xb;
              }
              else {
                local_90 = (snd_ctl_t *)CONCAT44(local_90._4_4_,uVar7);
                pcVar9[-8] = '\x05';
                pcVar9[-7] = -0x18;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                pbVar12 = (byte *)snd_pcm_info_get_name();
                pbVar4 = _cardIdx;
                bVar1 = *_cardIdx;
                pbVar23 = _cardIdx;
                while (bVar1 != 0) {
                  bVar1 = *pbVar12;
                  pbVar22 = pbVar12;
                  for (; (bVar1 != 0 && (pbVar22 = pbVar22 + 1, bVar1 == *pbVar23));
                      pbVar23 = pbVar23 + 1) {
                    bVar1 = *pbVar22;
                    if ((bVar1 & 0xdf) == 0) {
                      pbVar12 = pbVar22;
                    }
                  }
                  do {
                    bVar1 = *pbVar23;
                    if (bVar1 == 0) break;
                    pbVar23 = pbVar23 + 1;
                  } while (bVar1 != 0x20);
                  bVar1 = *pbVar23;
                }
                pbVar23 = (byte *)"-";
                if (*pbVar12 != 0) {
                  for (; bVar1 = *pbVar12, bVar1 == 0x20; pbVar12 = pbVar12 + 1) {
                  }
                  if ((bVar1 == 0x2d) || (pbVar23 = pbVar12, bVar1 == 0x3a)) {
                    pbVar23 = pbVar12 + (ulong)(pbVar12[1] == 0x20) * 2;
                  }
                }
                _devIdx = (PaAlsaDeviceInfo *)CONCAT44(devIdx_1,uVar6);
                local_40 = psVar25;
                pcVar9[-8] = -0x3d;
                pcVar9[-7] = -0x18;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                iVar5 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar4,pbVar23,&local_f8);
                pPVar2 = pPVar19->allocations;
                pcVar9[-8] = -0x29;
                pcVar9[-7] = -0x18;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                pcVar11 = (char *)PaUtil_GroupAllocateMemory(pPVar2,(long)(iVar5 + 1));
                pbVar12 = _cardIdx;
                if (pcVar11 == (char *)0x0) {
                  pcVar9[-8] = -2;
                  pcVar9[-7] = -0x17;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  PaUtil_DebugPrint(
                                   "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1327\n"
                                   );
                  local_38 = 0xffffd8f8;
                  iVar5 = 10;
                  pPVar19 = local_50;
                  psVar25 = local_40;
                  pcVar11 = local_88;
                }
                else {
                  pcVar9[-8] = -3;
                  pcVar9[-7] = -0x18;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  snprintf(pcVar11,(long)(iVar5 + 1),"%s: %s (%s)",pbVar12,pbVar23,&local_f8);
                  pHVar24 = local_48;
                  psVar25 = local_40 + 1;
                  if ((local_48 == (HwDevInfo *)0x0) || (ctl < psVar25)) {
                    psVar3 = (snd_ctl_t *)((long)ctl * 2);
                    sVar10 = (long)ctl << 6;
                    pcVar9[-8] = '.';
                    pcVar9[-7] = -0x17;
                    pcVar9[-6] = '\x10';
                    pcVar9[-5] = '\0';
                    pcVar9[-4] = '\0';
                    pcVar9[-3] = '\0';
                    pcVar9[-2] = '\0';
                    pcVar9[-1] = '\0';
                    local_48 = (HwDevInfo *)realloc(pHVar24,sVar10);
                    uVar6 = devIdx;
                    if (local_48 == (HwDevInfo *)0x0) {
                      pcVar9[-8] = 'F';
                      pcVar9[-7] = -0x16;
                      pcVar9[-6] = '\x10';
                      pcVar9[-5] = '\0';
                      pcVar9[-4] = '\0';
                      pcVar9[-3] = '\0';
                      pcVar9[-2] = '\0';
                      pcVar9[-1] = '\0';
                      PaUtil_DebugPrint(
                                       "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1335\n"
                                       );
                      local_38 = 0xffffd8f8;
                      iVar5 = 10;
                      local_48 = (HwDevInfo *)0x0;
                      pPVar19 = local_50;
                      pcVar11 = local_88;
                      ctl = psVar3;
                      goto LAB_0010e9b8;
                    }
                  }
                  else {
                    uVar6 = devIdx;
                    psVar3 = ctl;
                  }
                  ctl = psVar3;
                  psVar3 = local_40;
                  pPVar19 = local_50;
                  pcVar9[-8] = '^';
                  pcVar9[-7] = -0x17;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  paUtilErr_ = PaAlsa_StrDup(pPVar19,&local_b8,(char *)&local_f8);
                  if (paUtilErr_ < 0) {
                    pcVar9[-8] = '$';
                    pcVar9[-7] = -0x16;
                    pcVar9[-6] = '\x10';
                    pcVar9[-5] = '\0';
                    pcVar9[-4] = '\0';
                    pcVar9[-3] = '\0';
                    pcVar9[-2] = '\0';
                    pcVar9[-1] = '\0';
                    PaUtil_DebugPrint(
                                     "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1338\n"
                                     );
                    iVar5 = 10;
                    local_38 = (ulong)(uint)paUtilErr_;
                    pPVar19 = local_50;
                    pcVar11 = local_88;
                  }
                  else {
                    local_48[(long)psVar3].alsaName = local_b8;
                    local_48[(long)psVar3].name = pcVar11;
                    local_48[(long)psVar3].isPlug = topNode._4_4_;
                    local_48[(long)psVar3].hasPlayback = ~(uint)local_90 >> 0x1f;
                    local_48[(long)psVar3].hasCapture = ~uVar6 >> 0x1f;
                    iVar5 = 0;
                    pPVar19 = local_50;
                    pcVar11 = local_88;
                  }
                }
              }
LAB_0010e9b8:
              pcVar17 = cardName;
              if ((iVar5 != 0xb) && (iVar5 != 0)) goto LAB_0010ea77;
              pcVar9[-8] = -0x27;
              pcVar9[-7] = -0x17;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              iVar5 = snd_ctl_pcm_next_device(pcVar17,&local_5c);
            } while ((iVar5 == 0) && (-1 < local_5c));
          }
          pcVar11 = cardName;
          pcVar9[-8] = 'n';
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          snd_ctl_close(pcVar11);
          iVar5 = 0;
        }
      }
LAB_0010ea77:
      if ((iVar5 != 6) && (iVar5 != 0)) goto LAB_0010f030;
      pcVar9[-8] = -0x73;
      pcVar9[-7] = -0x16;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      iVar5 = snd_card_next(&local_80);
    } while ((iVar5 == 0) && (-1 < local_80));
  }
  if (_snd_config == 0) {
    pcVar9[-8] = -0x1e;
    pcVar9[-7] = -0x16;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    iVar5 = snd_config_update();
    pPVar19 = local_50;
    if (iVar5 < 0) {
      pcVar9[-8] = 'l';
      pcVar9[-7] = -0x10;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      BuildDeviceList_cold_1();
      local_38 = 0xffffd8f1;
      goto LAB_0010f030;
    }
  }
  if (_snd_config == 0) {
    pcVar9[-8] = -0x67;
    pcVar9[-7] = -0x10;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    __assert_fail("*alsa_snd_config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x54c,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
  }
  pcVar9[-8] = '\x17';
  pcVar9[-7] = -0x15;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  iVar5 = snd_config_search(_snd_config,"pcm",&local_a0);
  uVar16 = local_a0;
  if (-1 < iVar5) {
    pcVar9[-8] = '+';
    pcVar9[-7] = -0x15;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    lVar13 = snd_config_iterator_first(uVar16);
    pcVar9[-8] = '6';
    pcVar9[-7] = -0x15;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    lVar14 = snd_config_iterator_next(lVar13);
    uVar16 = local_a0;
    pcVar9[-8] = 'E';
    pcVar9[-7] = -0x15;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    lVar15 = snd_config_iterator_end(uVar16);
    if (lVar13 == lVar15) {
      bVar26 = true;
    }
    else {
      do {
        local_f8 = "unknown";
        _cardIdx = (byte *)0x0;
        local_40 = psVar25;
        pcVar9[-8] = 'y';
        pcVar9[-7] = -0x15;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        uVar16 = snd_config_iterator_entry(lVar13);
        cardName = (char *)0x0;
        pcVar9[-8] = -0x6d;
        pcVar9[-7] = -0x15;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar5 = snd_config_search(uVar16,"type",&cardName);
        pcVar11 = cardName;
        lVar13 = lVar14;
        if (iVar5 < 0) {
          if (iVar5 == -2) goto LAB_0010ebcb;
          pcVar9[-8] = -0x48;
          pcVar9[-7] = -0x14;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          __thread1 = pthread_self();
          pcVar9[-8] = -0x36;
          pcVar9[-7] = -0x14;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar8 = pthread_equal(__thread1,paUnixMainThread);
          if (iVar8 != 0) {
            pcVar9[-8] = -0x27;
            pcVar9[-7] = -0x14;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            pcVar11 = (char *)snd_strerror(iVar5);
            pcVar9[-8] = -0x17;
            pcVar9[-7] = -0x14;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar5,pcVar11);
          }
          pcVar9[-8] = -9;
          pcVar9[-7] = -0x14;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          PaUtil_DebugPrint(
                           "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1374\n"
                           );
          local_38 = 0xffffd8f1;
          iVar5 = 10;
          psVar25 = local_40;
        }
        else {
          pcVar9[-8] = -0x59;
          pcVar9[-7] = -0x15;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar5 = snd_config_get_string(pcVar11,&local_f8);
          if (iVar5 < 0) {
            pcVar9[-8] = '\x0f';
            pcVar9[-7] = -0x12;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            BuildDeviceList_cold_2();
            local_38 = 0xffffd8f1;
            iVar5 = 10;
            psVar25 = local_40;
          }
          else {
LAB_0010ebcb:
            pcVar9[-8] = -0x29;
            pcVar9[-7] = -0x15;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            iVar5 = snd_config_get_id(uVar16,&cardIdx);
            pbVar12 = _cardIdx;
            if (iVar5 < 0) {
              pcVar9[-8] = '*';
              pcVar9[-7] = -0x12;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              BuildDeviceList_cold_3();
              local_38 = 0xffffd8f1;
              iVar5 = 10;
              psVar25 = local_40;
            }
            else {
              lVar15 = 0;
              do {
                pcVar11 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar15);
                pcVar9[-8] = '\x01';
                pcVar9[-7] = -0x14;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                iVar5 = strcmp((char *)pbVar12,pcVar11);
                pPVar19 = local_50;
                if (iVar5 == 0) break;
                bVar26 = lVar15 != 0x48;
                lVar15 = lVar15 + 8;
              } while (bVar26);
              if (iVar5 == 0) {
                iVar5 = 0x17;
                psVar25 = local_40;
              }
              else {
                pPVar2 = local_50->allocations;
                _devIdx = (PaAlsaDeviceInfo *)lVar14;
                pcVar9[-8] = '2';
                pcVar9[-7] = -0x14;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                sVar10 = strlen((char *)pbVar12);
                pcVar9[-8] = '>';
                pcVar9[-7] = -0x14;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                pcVar11 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar10 + 6);
                pbVar12 = _cardIdx;
                if (pcVar11 == (char *)0x0) {
                  pcVar9[-8] = 'K';
                  pcVar9[-7] = -0x12;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  PaUtil_DebugPrint(
                                   "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1390\n"
                                   );
                  local_38 = 0xffffd8f8;
                  iVar5 = 10;
                  lVar13 = (long)_devIdx;
                  psVar25 = local_40;
                }
                else {
                  pcVar9[-8] = 'V';
                  pcVar9[-7] = -0x14;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  strcpy(pcVar11,(char *)pbVar12);
                  pbVar12 = _cardIdx;
                  pPVar2 = pPVar19->allocations;
                  pcVar9[-8] = 'f';
                  pcVar9[-7] = -0x14;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  sVar10 = strlen((char *)pbVar12);
                  pcVar9[-8] = 'r';
                  pcVar9[-7] = -0x14;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  pcVar17 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar10 + 1);
                  psVar25 = local_40;
                  pbVar12 = _cardIdx;
                  if (pcVar17 == (char *)0x0) {
                    pcVar9[-8] = 'p';
                    pcVar9[-7] = -0x12;
                    pcVar9[-6] = '\x10';
                    pcVar9[-5] = '\0';
                    pcVar9[-4] = '\0';
                    pcVar9[-3] = '\0';
                    pcVar9[-2] = '\0';
                    pcVar9[-1] = '\0';
                    PaUtil_DebugPrint(
                                     "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1393\n"
                                     );
                    local_38 = 0xffffd8f8;
                    iVar5 = 10;
                    lVar13 = (long)_devIdx;
                  }
                  else {
                    pcVar9[-8] = -0x72;
                    pcVar9[-7] = -0x14;
                    pcVar9[-6] = '\x10';
                    pcVar9[-5] = '\0';
                    pcVar9[-4] = '\0';
                    pcVar9[-3] = '\0';
                    pcVar9[-2] = '\0';
                    pcVar9[-1] = '\0';
                    strcpy(pcVar17,(char *)pbVar12);
                    pHVar24 = local_48;
                    local_90 = psVar25 + 1;
                    if ((local_48 == (HwDevInfo *)0x0) || (psVar3 = ctl, ctl < local_90)) {
                      psVar3 = (snd_ctl_t *)((long)ctl * 2);
                      sVar10 = (long)ctl << 6;
                      pcVar9[-8] = '*';
                      pcVar9[-7] = -0x13;
                      pcVar9[-6] = '\x10';
                      pcVar9[-5] = '\0';
                      pcVar9[-4] = '\0';
                      pcVar9[-3] = '\0';
                      pcVar9[-2] = '\0';
                      pcVar9[-1] = '\0';
                      local_48 = (HwDevInfo *)realloc(pHVar24,sVar10);
                      if (local_48 == (HwDevInfo *)0x0) {
                        pcVar9[-8] = -0x6f;
                        pcVar9[-7] = -0x12;
                        pcVar9[-6] = '\x10';
                        pcVar9[-5] = '\0';
                        pcVar9[-4] = '\0';
                        pcVar9[-3] = '\0';
                        pcVar9[-2] = '\0';
                        pcVar9[-1] = '\0';
                        PaUtil_DebugPrint(
                                         "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1401\n"
                                         );
                        local_38 = 0xffffd8f8;
                        iVar5 = 10;
                        local_48 = (HwDevInfo *)0x0;
                        lVar13 = (long)_devIdx;
                        psVar25 = local_90;
                        ctl = psVar3;
                        goto LAB_0010edd5;
                      }
                    }
                    ctl = psVar3;
                    if (predefinedNames[0].alsaName == (char *)0x0) {
LAB_0010ed78:
                      pHVar24 = (HwDevInfo *)0x0;
                    }
                    else {
                      pcVar9[-8] = 'R';
                      pcVar9[-7] = -0x13;
                      pcVar9[-6] = '\x10';
                      pcVar9[-5] = '\0';
                      pcVar9[-4] = '\0';
                      pcVar9[-3] = '\0';
                      pcVar9[-2] = '\0';
                      pcVar9[-1] = '\0';
                      iVar5 = strcmp(pcVar11,predefinedNames[0].alsaName);
                      pHVar24 = predefinedNames;
                      if (iVar5 != 0) {
                        pHVar24 = predefinedNames;
                        do {
                          __s2 = pHVar24[1].alsaName;
                          if (__s2 == (char *)0x0) goto LAB_0010ed78;
                          pcVar9[-8] = 'n';
                          pcVar9[-7] = -0x13;
                          pcVar9[-6] = '\x10';
                          pcVar9[-5] = '\0';
                          pcVar9[-4] = '\0';
                          pcVar9[-3] = '\0';
                          pcVar9[-2] = '\0';
                          pcVar9[-1] = '\0';
                          iVar5 = strcmp(pcVar11,__s2);
                          pHVar24 = pHVar24 + 1;
                        } while (iVar5 != 0);
                      }
                    }
                    local_48[(long)local_40].alsaName = pcVar11;
                    local_48[(long)local_40].name = pcVar17;
                    local_48[(long)local_40].isPlug = 1;
                    if (pHVar24 == (HwDevInfo *)0x0) {
                      local_48[(long)local_40].hasPlayback = 1;
                      local_48[(long)local_40].hasCapture = 1;
                    }
                    else {
                      local_48[(long)local_40].hasPlayback = pHVar24->hasPlayback;
                      local_48[(long)local_40].hasCapture = pHVar24->hasCapture;
                    }
                    iVar5 = 0;
                    lVar13 = (long)_devIdx;
                    psVar25 = local_90;
                  }
                }
              }
            }
          }
        }
LAB_0010edd5:
        if ((iVar5 != 0x17) && (iVar5 != 0)) goto LAB_0010eeb2;
        pcVar9[-8] = -0x16;
        pcVar9[-7] = -0x13;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        lVar14 = snd_config_iterator_next(lVar13);
        uVar16 = local_a0;
        pcVar9[-8] = -7;
        pcVar9[-7] = -0x13;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        lVar15 = snd_config_iterator_end(uVar16);
      } while (lVar13 != lVar15);
      iVar5 = 0;
LAB_0010eeb2:
      bVar26 = iVar5 == 0;
    }
    pPVar19 = local_50;
    if (!bVar26) goto LAB_0010f030;
  }
  pPVar2 = pPVar19->allocations;
  pcVar9[-8] = -0x25;
  pcVar9[-7] = -0x12;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  ppPVar18 = (PaDeviceInfo **)PaUtil_GroupAllocateMemory(pPVar2,(long)psVar25 * 8);
  (pPVar19->baseHostApiRep).deviceInfos = ppPVar18;
  if (ppPVar18 == (PaDeviceInfo **)0x0) {
    pcVar11 = 
    "Expression \'baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1427\n"
    ;
  }
  else {
    pPVar2 = pPVar19->allocations;
    pcVar9[-8] = -1;
    pcVar9[-7] = -0x12;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    devInfo = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar2,(long)psVar25 * 0x60);
    if (devInfo != (PaAlsaDeviceInfo *)0x0) {
      local_60 = 0;
      devInfo_00 = devInfo;
      local_40 = psVar25;
      pHVar24 = local_48;
      deviceHwInfo = local_48;
      for (; _devIdx = devInfo_00, local_48 = deviceHwInfo, psVar25 != (snd_ctl_t *)0x0;
          psVar25 = psVar25 + -1) {
        pcVar11 = pHVar24->name;
        pcVar9[-8] = '<';
        pcVar9[-7] = -0x11;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar5 = strcmp(pcVar11,"dmix");
        iVar8 = 0x2a;
        if (iVar5 != 0) {
          pcVar9[-8] = 'U';
          pcVar9[-7] = -0x11;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar5 = strcmp(pcVar11,"default");
          pPVar19 = local_50;
          uVar6 = local_7c;
          if (iVar5 != 0) {
            pcVar9[-8] = 'o';
            pcVar9[-7] = -0x11;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            FillInDevInfo(pPVar19,pHVar24,uVar6,devInfo,&local_60);
            paUtilErr_ = 0;
            iVar8 = 0;
          }
        }
        if ((iVar8 != 0x2a) && (iVar8 != 0)) goto LAB_0010f030;
        pHVar24 = pHVar24 + 1;
        devInfo = devInfo + 1;
        devInfo_00 = _devIdx;
        deviceHwInfo = local_48;
      }
      if (local_40 <= (snd_ctl_t *)(long)local_60) {
        *(code **)(pcVar9 + -8) = CloseStream;
        __assert_fail("devIdx < numDeviceNames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x5ad,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
      }
      do {
        pcVar11 = deviceHwInfo->name;
        pcVar9[-8] = -0x34;
        pcVar9[-7] = -0x11;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar5 = strcmp(pcVar11,"dmix");
        if (iVar5 == 0) {
LAB_0010efe4:
          pPVar19 = local_50;
          uVar6 = local_7c;
          pcVar9[-8] = -6;
          pcVar9[-7] = -0x11;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          FillInDevInfo(pPVar19,deviceHwInfo,uVar6,devInfo_00,&local_60);
          paUtilErr_ = 0;
          iVar8 = 0;
        }
        else {
          pcVar9[-8] = -0x25;
          pcVar9[-7] = -0x11;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar5 = strcmp(pcVar11,"default");
          iVar8 = 0x2f;
          if (iVar5 == 0) goto LAB_0010efe4;
        }
        pHVar24 = local_48;
        if ((iVar8 != 0x2f) && (iVar8 != 0)) goto LAB_0010f030;
        deviceHwInfo = deviceHwInfo + 1;
        devInfo_00 = devInfo_00 + 1;
        local_40 = local_40 + -1;
      } while (local_40 != (snd_ctl_t *)0x0);
      pcVar9[-8] = '&';
      pcVar9[-7] = -0x10;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      free(pHVar24);
      (local_50->baseHostApiRep).info.deviceCount = local_60;
      goto LAB_0010f030;
    }
    pcVar11 = 
    "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1431\n"
    ;
  }
  pcVar9[-8] = 'Z';
  pcVar9[-7] = -0x10;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  PaUtil_DebugPrint(pcVar11);
  local_38 = 0xffffd8f8;
LAB_0010f030:
  return (PaError)local_38;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi )
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* These two will be set to the first working input and output device, respectively */
    baseApi->info.defaultInputDevice = paNoDevice;
    baseApi->info.defaultOutputDevice = paNoDevice;

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[50];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    assert( devIdx < numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    free( hwDevInfos );

    baseApi->info.deviceCount = devIdx;   /* Number of successfully queried devices */

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    return result;

error:
    /* No particular action */
    goto end;
}